

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O1

int lws_cache_heap_get(lws_cache_ttl_lru *_c,char *specific_key,void **pdata,size_t *psize)

{
  int iVar1;
  lws_cache_ops *plVar2;
  _func_int_lws_cache_ttl_lru_ptr_char_ptr **pp_Var3;
  
  plVar2 = _c[1].info.ops;
  if (plVar2 == (lws_cache_ops *)0x0) {
    pp_Var3 = (_func_int_lws_cache_ttl_lru_ptr_char_ptr **)0x0;
  }
  else {
    do {
      iVar1 = strcmp(specific_key,(char *)(plVar2->lookup + (long)plVar2 + 0x30));
      pp_Var3 = &plVar2[-1].invalidate;
      if (iVar1 == 0) goto LAB_0010e9c4;
      plVar2 = (lws_cache_ops *)plVar2->destroy;
    } while (plVar2 != (lws_cache_ops *)0x0);
    pp_Var3 = (_func_int_lws_cache_ttl_lru_ptr_char_ptr **)0x0;
  }
LAB_0010e9c4:
  if (pp_Var3 == (_func_int_lws_cache_ttl_lru_ptr_char_ptr **)0x0) {
    iVar1 = 1;
  }
  else {
    lws_dll2_remove((lws_dll2 *)(pp_Var3 + 3));
    lws_dll2_add_head((lws_dll2 *)(pp_Var3 + 3),(lws_dll2_owner *)&_c[1].info.parent);
    iVar1 = 0;
    if (pdata != (void **)0x0) {
      *pdata = pp_Var3 + 9;
      *psize = (size_t)pp_Var3[8];
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int
lws_cache_heap_get(struct lws_cache_ttl_lru *_c, const char *specific_key,
		   const void **pdata, size_t *psize)
{
	lws_cache_ttl_lru_t_heap_t *cache = (lws_cache_ttl_lru_t_heap_t *)_c;
	lws_cache_ttl_item_heap_t *item;

	item = lws_cache_heap_specific(cache, specific_key);
	if (!item)
		return 1;

	/* we are using it, move it to lru head */
	lws_dll2_remove(&item->list_lru);
	lws_dll2_add_head(&item->list_lru, &cache->items_lru);

	if (pdata) {
		*pdata = (const void *)&item[1];
		*psize = item->size;
	}

	return 0;
}